

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

int * __thiscall cxxopts::OptionValue::as<int>(OptionValue *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  pointer pcVar3;
  long lVar4;
  int *piVar5;
  element_type *peVar6;
  string local_30;
  
  peVar6 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    psVar2 = this->m_long_name;
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    if (psVar2 == (string *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
    }
    else {
      pcVar3 = (psVar2->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_30,pcVar3,pcVar3 + psVar2->_M_string_length);
    }
    throw_or_mimic<cxxopts::option_has_no_value_exception>(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    peVar6 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  lVar4 = __dynamic_cast(peVar6,&Value::typeinfo,&values::standard_value<int>::typeinfo,0);
  if (lVar4 != 0) {
    piVar5 = *(int **)(lVar4 + 0x28);
    if (piVar5 == (int *)0x0) {
      piVar5 = *(int **)(lVar4 + 0x18);
    }
    return piVar5;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
          throw_or_mimic<option_has_no_value_exception>(
              m_long_name == nullptr ? "" : *m_long_name);
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }